

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool get_fullpath(char *path,char *dest)

{
  char *pcVar1;
  
  pcVar1 = realpath(path,dest);
  if (pcVar1 == (char *)0x0) {
    memset(dest,0,0x104);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool get_fullpath(const char *path, char *dest)
{
#if defined(_WIN32)
	if (_fullpath(dest, path, MAX_PATH) == NULL)
#else
	if (realpath(path, dest) == NULL)
#endif
	{
		clear_path_string(dest, MAX_PATH);
		return false;
	}
	return true;
}